

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::dump_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int error)

{
  size_t sVar1;
  char *__s;
  
  if (error - 1U < 7) {
    __s = &DAT_00140440 + *(int *)(&DAT_00140440 + (ulong)(error - 1U) * 4);
  }
  else {
    __s = "unknown error";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string dump_error_category::message (int error) const {
        auto * result = "unknown error";
        switch (static_cast<dump_error_code> (error)) {
        case dump_error_code::bad_digest: result = "bad digest"; break;
        case dump_error_code::no_fragment_index: result = "no fragment index"; break;
        case dump_error_code::fragment_not_found: result = "fragment not found"; break;
        case dump_error_code::no_compilation_index: result = "no compilation index"; break;
        case dump_error_code::compilation_not_found: result = "compilation not found"; break;
        case dump_error_code::debug_line_header_not_found:
            result = "debug line header not found";
            break;
        case dump_error_code::no_debug_line_header_index:
            result = "no debug line header index";
            break;
        }
        return result;
    }